

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O1

void pollwrap_add_fd_rwx(pollwrapper *pw,int fd,int rwx)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = -(rwx & 1U) & 0xc1;
  uVar2 = uVar1 + 0x304;
  if ((rwx & 2U) == 0) {
    uVar2 = uVar1;
  }
  pollwrap_add_fd_events(pw,fd,(uint)rwx >> 1 & 2 | uVar2);
  return;
}

Assistant:

void pollwrap_add_fd_rwx(pollwrapper *pw, int fd, int rwx)
{
    int events = 0;
    if (rwx & SELECT_R)
        events |= SELECT_R_IN;
    if (rwx & SELECT_W)
        events |= SELECT_W_IN;
    if (rwx & SELECT_X)
        events |= SELECT_X_IN;
    pollwrap_add_fd_events(pw, fd, events);
}